

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmyblas2.c
# Opt level: O0

void dusolve(int ldm,int ncol,double *M,double *rhs)

{
  double dVar1;
  double dVar2;
  int local_34;
  int local_30;
  int irow;
  int j;
  int jcol;
  double xj;
  double *rhs_local;
  double *M_local;
  int ncol_local;
  int ldm_local;
  
  irow = ncol + -1;
  for (local_30 = 0; local_30 < ncol; local_30 = local_30 + 1) {
    dVar1 = rhs[irow];
    dVar2 = M[irow + irow * ldm];
    rhs[irow] = dVar1 / dVar2;
    for (local_34 = 0; local_34 < irow; local_34 = local_34 + 1) {
      rhs[local_34] = -(dVar1 / dVar2) * M[local_34 + irow * ldm] + rhs[local_34];
    }
    irow = irow + -1;
  }
  return;
}

Assistant:

void dusolve (int ldm, int ncol, double *M, double *rhs)
{
    double xj;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	xj = rhs[jcol] / M[jcol + jcol*ldm]; 		/* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++)
	    rhs[irow] -= xj * M[irow + jcol*ldm];	/* M(irow, jcol) */

	jcol--;

    }
}